

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O2

void concept_suite::random_access_iterator_subtraction_assignment(void)

{
  initializer_list<int> __l;
  iterator iVar1;
  undefined4 local_6c;
  difference_type local_68;
  iterator a;
  vector<int,_std::allocator<int>_> data;
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = (pointer)0x160000000b;
  span.member.cap = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&span;
  std::vector<int,_std::allocator<int>_>::vector(&data,__l,(allocator_type *)&a);
  span.member.data = (pointer)0x0;
  if ((long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    span.member.data =
         data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
  }
  span.member.cap =
       (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  span.member.size = span.member.cap;
  span.member.next = span.member.cap;
  a = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator-=(&a,2);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_68 = std::__distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (iVar1.parent,iVar1.current,a.parent,a.current);
  local_6c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), a)","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,200,"void concept_suite::random_access_iterator_subtraction_assignment()",&local_68,
             &local_6c);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&data.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void random_access_iterator_subtraction_assignment()
{
    // r -= n
    std::vector<int> data = { 11, 22, 33, 44 };
    circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::iterator a = span.end();
    a -= 2;
    BOOST_TEST_EQ(std::distance(span.begin(), a), 2);
}